

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

bool __thiscall wabt::WastParser::ParseRefTypeOpt(WastParser *this,Type *out_type)

{
  bool bVar1;
  Type ty;
  Type type;
  Token token;
  Type *out_type_local;
  WastParser *this_local;
  
  bVar1 = PeekMatch(this,First_Type,0);
  if (bVar1) {
    Consume((Token *)&type,this);
    ty = Token::type((Token *)&type);
    bVar1 = wabt::operator==(ty,ExternRef);
    if ((!bVar1) || (bVar1 = Features::reference_types_enabled(&this->options_->features), bVar1)) {
      *out_type = ty;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool WastParser::ParseRefTypeOpt(Type* out_type) {
  WABT_TRACE(ParseRefTypeOpt);
  if (!PeekMatch(TokenType::ValueType)) {
    return false;
  }

  Token token = Consume();
  Type type = token.type();
  if (type == Type::ExternRef &&
      !options_->features.reference_types_enabled()) {
    return false;
  }

  *out_type = type;
  return true;
}